

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::write_int_noinline<char,fmt::v10::appender,unsigned_long>
                   (appender out,write_int_arg<unsigned_long> arg,format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  undefined5 uVar2;
  undefined8 uVar3;
  uint uVar4;
  char *digits;
  ulong uVar5;
  appender aVar6;
  byte *pbVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  appender it;
  ulong value;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  format_decimal_result<char_*> fVar18;
  char buffer [20];
  write_int_data<char> data;
  anon_class_40_3_03e05ccd_conflict local_88;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  write_int_data<char> local_40;
  
  uVar3 = local_88.write_digits._8_8_;
  value = arg.abs_value;
  pVar1 = specs->type;
  uVar11 = arg.prefix;
  switch(pVar1) {
  case none:
  case dec:
    lVar15 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    iVar14 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15]
                                      * 8));
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_40,iVar14,uVar11,specs);
      local_88.prefix = uVar11;
      local_88.data.size._0_6_ = (undefined6)local_40.size;
      local_88.data.size._6_2_ = (undefined2)(local_40.size >> 0x30);
      local_88.data.padding._0_4_ = (uint)local_40.padding;
      local_88.data.padding._4_2_ = (undefined2)(local_40.padding >> 0x20);
      local_88.data.padding._6_2_ = (undefined2)(local_40.padding >> 0x30);
      local_88.write_digits.num_digits = iVar14;
      local_88.write_digits.abs_value = value;
      aVar6 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,local_40.size,local_40.size,(anon_class_40_3_03e05ccd *)&local_88
                        );
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if (iVar14 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                  ,0x189,"negative value");
    }
    if ((uVar11 != 0) &&
       (uVar11 = uVar11 & 0xffffff,
       ((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
      do {
        lVar15 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container + 0x10);
        uVar5 = lVar15 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) < uVar5) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
          lVar15 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                   container + 0x10);
          uVar5 = lVar15 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x10) = uVar5;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar15) = (char)uVar11;
        bVar17 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar17);
    }
    local_88.prefix = 0;
    local_88._4_4_ = 0;
    local_88.data.size._0_6_ = 0;
    local_88.data.size._6_2_ = 0;
    local_88.data.padding._0_4_ = 0;
    fVar18 = format_decimal<char,unsigned_long>((char *)&local_88,value,iVar14);
    pcVar8 = fVar18.end;
    goto LAB_00114c46;
  case oct:
    uVar5 = value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = 7 < uVar5;
      uVar5 = uVar5 >> 3;
    } while (bVar17);
    iVar14 = (int)lVar15;
    if (((specs->field_0x9 & 0x80) != 0) && (value != 0 && specs->precision <= iVar14)) {
      uVar10 = 0x3000;
      if (uVar11 == 0) {
        uVar10 = 0x30;
      }
      uVar11 = (uVar10 | uVar11) + 0x1000000;
    }
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_40,iVar14,uVar11,specs);
      local_88.prefix = uVar11;
      local_88.data.size._0_6_ = (undefined6)local_40.size;
      local_88.data.size._6_2_ = (undefined2)(local_40.size >> 0x30);
      local_88.data.padding._0_4_ = (uint)local_40.padding;
      local_88.data.padding._4_2_ = (undefined2)(local_40.padding >> 0x20);
      local_88.data.padding._6_2_ = (undefined2)(local_40.padding >> 0x30);
      local_88.write_digits.num_digits = iVar14;
      local_88.write_digits.abs_value = value;
      aVar6 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,local_40.size,local_40.size,(anon_class_40_3_03e05ccd *)&local_88
                        );
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((uVar11 != 0) && (uVar10 = uVar11 & 0xffffff, (uVar11 & 0xffffff) != 0)) {
      do {
        lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar9 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) < uVar5) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x10);
          uVar5 = lVar9 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x10) = uVar5;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar9) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar9 + lVar15;
    if (uVar5 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x18)) {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      if (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 8) != 0) {
        pbVar7 = (byte *)(lVar15 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                                  .container + 8) + lVar9);
        do {
          pbVar7 = pbVar7 + -1;
          *pbVar7 = (byte)value & 7 | 0x30;
          bVar17 = 7 < value;
          value = value >> 3;
        } while (bVar17);
        return (appender)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
      }
    }
    pbVar7 = (byte *)((long)&local_88.prefix + lVar16);
    local_88.prefix = 0;
    local_88._4_4_ = 0;
    local_88.data.padding._0_4_ = 0;
    local_88.data.padding._4_2_ = 0;
    pcVar8 = (char *)((long)&local_88.prefix + lVar16 + 1);
    do {
      *pbVar7 = (byte)value & 7 | 0x30;
      pbVar7 = pbVar7 + -1;
      bVar17 = 7 < value;
      value = value >> 3;
    } while (bVar17);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar10 = uVar4 << 8;
      if (uVar11 == 0) {
        uVar10 = uVar4;
      }
      uVar11 = (uVar10 | uVar11) + 0x2000000;
    }
    uVar5 = value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = 0xf < uVar5;
      uVar5 = uVar5 >> 4;
    } while (bVar17);
    if (specs->precision != -1 || specs->width != 0) {
      local_88.write_digits._8_5_ = ((uint5)(pVar1 == hex_upper) << 0x20) + (int5)lVar15;
      uVar2 = local_88.write_digits._8_5_;
      local_88.write_digits._8_8_ = uVar3;
      write_int_data<char>::write_int_data(&local_40,(int)lVar15,uVar11,specs);
      local_88.prefix = uVar11;
      local_88.data.size._0_6_ = (undefined6)local_40.size;
      local_88.data.size._6_2_ = (undefined2)(local_40.size >> 0x30);
      local_88.data.padding._0_4_ = (uint)local_40.padding;
      local_88.data.padding._4_2_ = (undefined2)(local_40.padding >> 0x20);
      local_88.data.padding._6_2_ = (undefined2)(local_40.padding >> 0x30);
      local_88.write_digits._8_8_ = CONCAT35(local_88.write_digits._13_3_,uVar2);
      local_88.write_digits.abs_value = value;
      aVar6 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,local_40.size,local_40.size,&local_88);
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((uVar11 != 0) && (uVar10 = uVar11 & 0xffffff, (uVar11 & 0xffffff) != 0)) {
      do {
        lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar9 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) < uVar5) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x10);
          uVar5 = lVar9 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x10) = uVar5;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar9) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar9 + lVar15;
    if (uVar5 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x18)) {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      if (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 8) != 0) {
        pcVar8 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar8 = "0123456789ABCDEF";
        }
        pcVar12 = (char *)(*(long *)((long)out.
                                           super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                           .container + 8) + lVar9 + lVar15);
        do {
          pcVar12 = pcVar12 + -1;
          *pcVar12 = pcVar8[(uint)value & 0xf];
          bVar17 = 0xf < value;
          value = value >> 4;
        } while (bVar17);
        return (appender)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
      }
    }
    pcVar12 = (char *)((long)&local_88.prefix + lVar16);
    local_88.prefix = 0;
    local_88._4_4_ = 0;
    local_88.data.padding._0_4_ = (uint)local_88.data.padding & 0xffffff00;
    pcVar8 = (char *)((long)&local_88.prefix + lVar16 + 1);
    pcVar13 = "0123456789abcdef";
    if (pVar1 == hex_upper) {
      pcVar13 = "0123456789ABCDEF";
    }
    do {
      *pcVar12 = pcVar13[(uint)value & 0xf];
      pcVar12 = pcVar12 + -1;
      bVar17 = 0xf < value;
      value = value >> 4;
    } while (bVar17);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar10 = uVar4 << 8;
      if (uVar11 == 0) {
        uVar10 = uVar4;
      }
      uVar11 = (uVar10 | uVar11) + 0x2000000;
    }
    uVar5 = value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = 1 < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar17);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_40,(int)lVar15,uVar11,specs);
      local_88.prefix = uVar11;
      local_88.data.size._0_6_ = (undefined6)local_40.size;
      local_88.data.size._6_2_ = (undefined2)(local_40.size >> 0x30);
      local_88.data.padding._0_4_ = (uint)local_40.padding;
      local_88.data.padding._4_2_ = (undefined2)(local_40.padding >> 0x20);
      local_88.data.padding._6_2_ = (undefined2)(local_40.padding >> 0x30);
      local_88.write_digits.num_digits = (int)lVar15;
      local_88.write_digits.abs_value = value;
      aVar6 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,local_40.size,local_40.size,(anon_class_40_3_03e05ccd *)&local_88
                        );
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((uVar11 != 0) && (uVar10 = uVar11 & 0xffffff, (uVar11 & 0xffffff) != 0)) {
      do {
        lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar9 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) < uVar5) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
          lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x10);
          uVar5 = lVar9 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x10) = uVar5;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar9) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar9 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar9 + lVar15;
    if (uVar5 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 0x18)) {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      if (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 8) != 0) {
        pbVar7 = (byte *)(lVar15 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v10::detail::buffer<char>_>
                                                  .container + 8) + lVar9);
        do {
          pbVar7 = pbVar7 + -1;
          *pbVar7 = (byte)value & 1 | 0x30;
          bVar17 = 1 < value;
          value = value >> 1;
        } while (bVar17);
        return (appender)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
      }
    }
    pbVar7 = (byte *)((long)&local_88.prefix + lVar16);
    local_58 = 0;
    uStack_50 = 0;
    local_88.write_digits.num_digits = 0;
    local_88.write_digits.upper = false;
    local_88.write_digits._13_3_ = 0;
    uStack_60 = 0;
    local_88.data.padding._0_4_ = 0;
    local_88.data.padding._4_2_ = 0;
    local_88.data.padding._6_2_ = 0;
    local_88.write_digits.abs_value = 0;
    local_88.prefix = 0;
    local_88._4_4_ = 0;
    local_48 = 0;
    pcVar8 = (char *)((long)&local_88.prefix + lVar16 + 1);
    do {
      *pbVar7 = (byte)value & 1 | 0x30;
      pbVar7 = pbVar7 + -1;
      bVar17 = 1 < value;
      value = value >> 1;
    } while (bVar17);
    break;
  default:
    throw_format_error("invalid format specifier");
  case chr:
    local_88._0_8_ = (ulong)CONCAT61(local_88._2_6_,(char)arg.abs_value) << 8;
    aVar6 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)&local_88);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  local_88.data.size._6_2_ = 0;
  local_88.data.size._0_6_ = 0;
LAB_00114c46:
  aVar6 = copy_str_noinline<char,char*,fmt::v10::appender>((char *)&local_88,pcVar8,out);
  return (appender)
         aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}